

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_ghost.cpp
# Opt level: O3

Remotes * Omega_h::push_elem_uses
                    (Remotes *__return_storage_ptr__,RemoteGraph *own_verts2own_elems,
                    Dist *own_verts2verts)

{
  int *piVar1;
  void **ppvVar2;
  ulong uVar3;
  long lVar4;
  Alloc *pAVar5;
  int iVar6;
  void *pvVar7;
  void *pvVar8;
  void *pvVar9;
  Dist *this;
  Alloc *pAVar10;
  Alloc *pAVar11;
  Alloc *pAVar12;
  Remotes *pRVar13;
  uint uVar14;
  int iVar15;
  LO nrroots;
  long lVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  int iVar20;
  long lVar21;
  long lVar22;
  bool bVar23;
  Write<int> vert_idxs;
  Write<int> vert_ranks;
  Write<int> elem_idxs;
  Write<int> elem_ranks;
  LOs own_verts2serv_verts;
  Dist verts2own_verts;
  LOs own_verts2items;
  LOs own_verts2serv_uses;
  Remotes serv_uses2own_elems;
  Dist items2verts;
  Remotes items2own_elems;
  Remotes items2verts_map;
  Remotes serv_verts2verts;
  type f;
  Write<int> local_438;
  Write<int> local_428;
  Write<int> local_418;
  Write<int> local_408;
  Alloc *local_3f8;
  void *local_3f0;
  Read<int> *local_3e8;
  Dist *local_3e0;
  undefined1 local_3d8 [32];
  Alloc *local_3b8;
  void *local_3b0;
  Alloc *local_3a8;
  void *local_3a0;
  Alloc *local_398;
  void *local_390;
  Alloc *local_388;
  void *local_380;
  Alloc *local_378;
  void *local_370;
  element_type *local_368;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_360;
  element_type *local_358;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_350;
  Alloc *local_348;
  void *local_340;
  Alloc *local_338;
  void *local_330;
  Write<int> local_328;
  Write<int> local_318;
  Write<int> local_308;
  Write<int> local_2f8;
  LOs local_2e8;
  LOs local_2d8;
  Read<int> local_2c8;
  Alloc *local_2b8;
  void *local_2b0;
  Remotes local_2a8;
  Remotes local_288;
  Alloc *local_268;
  void *local_260;
  Alloc *local_258;
  void *local_250;
  Dist local_248;
  Alloc *local_1b8;
  void *pvStack_1b0;
  Alloc *local_1a8;
  void *pvStack_1a0;
  Remotes *local_198;
  Read<signed_char> local_190;
  Read<signed_char> local_180;
  Remotes local_170;
  CommPtr local_150;
  Read<signed_char> local_140;
  Read<signed_char> local_130;
  Remotes local_120;
  Remotes local_100;
  element_type *local_e0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d8;
  Alloc *local_d0;
  void *local_c8;
  Alloc *local_c0;
  void *local_b8;
  Alloc *local_b0;
  void *local_a8;
  Alloc *local_a0;
  void *local_98;
  Alloc *local_90;
  void *local_88;
  Alloc *local_80;
  void *local_78;
  element_type *local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  element_type *local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  Alloc *local_50;
  void *local_48;
  Alloc *local_40;
  void *local_38;
  
  local_2b8 = (own_verts2own_elems->locals2edges).write_.shared_alloc_.alloc;
  if (((ulong)local_2b8 & 7) == 0 && local_2b8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_2b8 = (Alloc *)(local_2b8->size * 8 + 1);
    }
    else {
      local_2b8->use_count = local_2b8->use_count + 1;
    }
  }
  pAVar10 = local_2b8;
  pvVar7 = (own_verts2own_elems->locals2edges).write_.shared_alloc_.direct_ptr;
  local_268 = (own_verts2own_elems->edges2remotes).ranks.write_.shared_alloc_.alloc;
  if (((ulong)local_268 & 7) == 0 && local_268 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_268 = (Alloc *)(local_268->size * 8 + 1);
    }
    else {
      local_268->use_count = local_268->use_count + 1;
    }
  }
  pAVar11 = local_268;
  pvVar8 = (own_verts2own_elems->edges2remotes).ranks.write_.shared_alloc_.direct_ptr;
  local_258 = (own_verts2own_elems->edges2remotes).idxs.write_.shared_alloc_.alloc;
  if (((ulong)local_258 & 7) == 0 && local_258 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_258 = (Alloc *)(local_258->size * 8 + 1);
    }
    else {
      local_258->use_count = local_258->use_count + 1;
    }
  }
  pAVar12 = local_258;
  pvVar9 = (own_verts2own_elems->edges2remotes).idxs.write_.shared_alloc_.direct_ptr;
  local_2b0 = pvVar7;
  local_260 = pvVar8;
  local_250 = pvVar9;
  uVar14 = Dist::nroots(own_verts2verts);
  local_198 = __return_storage_ptr__;
  Dist::roots2items(own_verts2verts);
  bVar23 = ((ulong)pAVar10 & 7) == 0;
  local_2d8.write_.shared_alloc_.alloc = pAVar10;
  if (bVar23 && pAVar10 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_2d8.write_.shared_alloc_.alloc = (Alloc *)(pAVar10->size * 8 + 1);
    }
    else {
      pAVar10->use_count = pAVar10->use_count + 1;
    }
  }
  local_2e8.write_.shared_alloc_.alloc = local_3f8;
  if (((ulong)local_3f8 & 7) == 0 && local_3f8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_2e8.write_.shared_alloc_.alloc = (Alloc *)(local_3f8->size * 8 + 1);
    }
    else {
      local_3f8->use_count = local_3f8->use_count + 1;
    }
  }
  local_2e8.write_.shared_alloc_.direct_ptr = local_3f0;
  local_3e0 = own_verts2verts;
  local_2d8.write_.shared_alloc_.direct_ptr = pvVar7;
  multiply_fans((Omega_h *)&local_2c8,&local_2d8,&local_2e8);
  pAVar5 = local_2e8.write_.shared_alloc_.alloc;
  if (((ulong)local_2e8.write_.shared_alloc_.alloc & 7) == 0 &&
      local_2e8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_2e8.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_2e8.write_.shared_alloc_.alloc);
      operator_delete(pAVar5,0x48);
    }
  }
  pAVar5 = local_2d8.write_.shared_alloc_.alloc;
  if (((ulong)local_2d8.write_.shared_alloc_.alloc & 7) == 0 &&
      local_2d8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_2d8.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_2d8.write_.shared_alloc_.alloc);
      operator_delete(pAVar5,0x48);
    }
  }
  local_3e8 = &local_2c8;
  iVar15 = Read<int>::last(local_3e8);
  Dist::items2dests(&local_100,local_3e0);
  pAVar5 = (Alloc *)(local_3d8 + 0x10);
  local_3d8._0_8_ = pAVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3d8,"");
  Write<int>::Write(&local_408,iVar15,(string *)local_3d8);
  if ((Alloc *)local_3d8._0_8_ != pAVar5) {
    operator_delete((void *)local_3d8._0_8_,(ulong)(local_3d8._16_8_ + 1));
  }
  local_3d8._0_8_ = pAVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3d8,"");
  Write<int>::Write(&local_418,iVar15,(string *)local_3d8);
  if ((Alloc *)local_3d8._0_8_ != pAVar5) {
    operator_delete((void *)local_3d8._0_8_,(ulong)(local_3d8._16_8_ + 1));
  }
  local_3d8._0_8_ = pAVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3d8,"");
  Write<int>::Write(&local_428,iVar15,(string *)local_3d8);
  if ((Alloc *)local_3d8._0_8_ != pAVar5) {
    operator_delete((void *)local_3d8._0_8_,(ulong)(local_3d8._16_8_ + 1));
  }
  local_3d8._0_8_ = pAVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3d8,"");
  Write<int>::Write(&local_438,iVar15,(string *)local_3d8);
  if ((Alloc *)local_3d8._0_8_ != pAVar5) {
    operator_delete((void *)local_3d8._0_8_,(ulong)(local_3d8._16_8_ + 1));
  }
  local_e0 = (element_type *)local_2c8.write_.shared_alloc_.alloc;
  if (((ulong)local_2c8.write_.shared_alloc_.alloc & 7) == 0 &&
      (element_type *)local_2c8.write_.shared_alloc_.alloc != (element_type *)0x0) {
    if (entering_parallel == '\x01') {
      local_e0 = (element_type *)((long)(local_2c8.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      ppvVar2 = &(((HostRead<int> *)&(local_2c8.write_.shared_alloc_.alloc)->ptr)->read_).write_.
                 shared_alloc_.direct_ptr;
      *(int *)ppvVar2 = *(int *)ppvVar2 + 1;
    }
  }
  local_d8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             local_2c8.write_.shared_alloc_.direct_ptr;
  local_d0 = local_3f8;
  if (((ulong)local_3f8 & 7) == 0 && local_3f8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_d0 = (Alloc *)(local_3f8->size * 8 + 1);
    }
    else {
      local_3f8->use_count = local_3f8->use_count + 1;
    }
  }
  local_c8 = local_3f0;
  local_c0 = pAVar10;
  if (bVar23 && pAVar10 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_c0 = (Alloc *)(pAVar10->size * 8 + 1);
    }
    else {
      pAVar10->use_count = pAVar10->use_count + 1;
    }
  }
  local_b0 = local_408.shared_alloc_.alloc;
  if (((ulong)local_408.shared_alloc_.alloc & 7) == 0 &&
      local_408.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_b0 = (Alloc *)((local_408.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_408.shared_alloc_.alloc)->use_count = (local_408.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_a8 = local_408.shared_alloc_.direct_ptr;
  local_a0 = pAVar11;
  if (((ulong)pAVar11 & 7) == 0 && pAVar11 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_a0 = (Alloc *)(pAVar11->size * 8 + 1);
    }
    else {
      pAVar11->use_count = pAVar11->use_count + 1;
    }
  }
  local_90 = pAVar12;
  if (((ulong)pAVar12 & 7) == 0 && pAVar12 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_90 = (Alloc *)(pAVar12->size * 8 + 1);
    }
    else {
      pAVar12->use_count = pAVar12->use_count + 1;
    }
  }
  local_80 = local_418.shared_alloc_.alloc;
  if (((ulong)local_418.shared_alloc_.alloc & 7) == 0 &&
      local_418.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_80 = (Alloc *)((local_418.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_418.shared_alloc_.alloc)->use_count = (local_418.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_78 = local_418.shared_alloc_.direct_ptr;
  local_70 = (element_type *)local_428.shared_alloc_.alloc;
  if (((ulong)local_428.shared_alloc_.alloc & 7) == 0 &&
      (element_type *)local_428.shared_alloc_.alloc != (element_type *)0x0) {
    if (entering_parallel == '\x01') {
      local_70 = (element_type *)((long)(local_428.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      ppvVar2 = &(((HostRead<int> *)&(local_428.shared_alloc_.alloc)->ptr)->read_).write_.
                 shared_alloc_.direct_ptr;
      *(int *)ppvVar2 = *(int *)ppvVar2 + 1;
    }
  }
  local_68 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_428.shared_alloc_.direct_ptr;
  local_60 = (element_type *)local_100.ranks.write_.shared_alloc_.alloc;
  if (((ulong)local_100.ranks.write_.shared_alloc_.alloc & 7) == 0 &&
      (element_type *)local_100.ranks.write_.shared_alloc_.alloc != (element_type *)0x0) {
    if (entering_parallel == '\x01') {
      local_60 = (element_type *)((long)(local_100.ranks.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      ppvVar2 = &(((HostRead<int> *)&(local_100.ranks.write_.shared_alloc_.alloc)->ptr)->read_).
                 write_.shared_alloc_.direct_ptr;
      *(int *)ppvVar2 = *(int *)ppvVar2 + 1;
    }
  }
  local_58 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             local_100.ranks.write_.shared_alloc_.direct_ptr;
  local_50 = local_100.idxs.write_.shared_alloc_.alloc;
  if (((ulong)local_100.idxs.write_.shared_alloc_.alloc & 7) == 0 &&
      local_100.idxs.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_50 = (Alloc *)((local_100.idxs.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_100.idxs.write_.shared_alloc_.alloc)->use_count =
           (local_100.idxs.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_48 = local_100.idxs.write_.shared_alloc_.direct_ptr;
  local_40 = local_438.shared_alloc_.alloc;
  if (((ulong)local_438.shared_alloc_.alloc & 7) == 0 &&
      local_438.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_40 = (Alloc *)((local_438.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_438.shared_alloc_.alloc)->use_count = (local_438.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_38 = local_438.shared_alloc_.direct_ptr;
  local_248.parent_comm_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_e0;
  if (((ulong)local_e0 & 7) == 0 && local_e0 != (element_type *)0x0) {
    if (entering_parallel == '\x01') {
      local_248.parent_comm_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)((long)local_e0->library_ * 8 + 1);
    }
    else {
      ppvVar2 = &(local_e0->host_srcs_).read_.write_.shared_alloc_.direct_ptr;
      *(int *)ppvVar2 = *(int *)ppvVar2 + 1;
    }
  }
  local_248.parent_comm_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2c8.write_.shared_alloc_.direct_ptr;
  local_248.roots2items_[0].write_.shared_alloc_.alloc = local_d0;
  if (((ulong)local_d0 & 7) == 0 && local_d0 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_248.roots2items_[0].write_.shared_alloc_.alloc = (Alloc *)(local_d0->size * 8 + 1);
    }
    else {
      local_d0->use_count = local_d0->use_count + 1;
    }
  }
  local_248.roots2items_[0].write_.shared_alloc_.direct_ptr = local_3f0;
  local_248.roots2items_[1].write_.shared_alloc_.alloc = local_c0;
  if (((ulong)local_c0 & 7) == 0 && local_c0 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_248.roots2items_[1].write_.shared_alloc_.alloc = (Alloc *)(local_c0->size * 8 + 1);
    }
    else {
      local_c0->use_count = local_c0->use_count + 1;
    }
  }
  local_248.items2content_[0].write_.shared_alloc_.alloc = local_b0;
  if (((ulong)local_b0 & 7) == 0 && local_b0 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_248.items2content_[0].write_.shared_alloc_.alloc = (Alloc *)(local_b0->size * 8 + 1);
    }
    else {
      local_b0->use_count = local_b0->use_count + 1;
    }
  }
  local_248.items2content_[0].write_.shared_alloc_.direct_ptr = local_408.shared_alloc_.direct_ptr;
  local_248.items2content_[1].write_.shared_alloc_.alloc = local_a0;
  if (((ulong)local_a0 & 7) == 0 && local_a0 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_248.items2content_[1].write_.shared_alloc_.alloc = (Alloc *)(local_a0->size * 8 + 1);
    }
    else {
      local_a0->use_count = local_a0->use_count + 1;
    }
  }
  local_248.msgs2content_[0].write_.shared_alloc_.alloc = local_90;
  if (((ulong)local_90 & 7) == 0 && local_90 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_248.msgs2content_[0].write_.shared_alloc_.alloc = (Alloc *)(local_90->size * 8 + 1);
    }
    else {
      local_90->use_count = local_90->use_count + 1;
    }
  }
  local_248.msgs2content_[1].write_.shared_alloc_.alloc = local_80;
  if (((ulong)local_80 & 7) == 0 && local_80 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_248.msgs2content_[1].write_.shared_alloc_.alloc = (Alloc *)(local_80->size * 8 + 1);
    }
    else {
      local_80->use_count = local_80->use_count + 1;
    }
  }
  local_248.msgs2content_[1].write_.shared_alloc_.direct_ptr = local_418.shared_alloc_.direct_ptr;
  local_248.comm_[0].super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_70
  ;
  if (((ulong)local_70 & 7) == 0 && local_70 != (element_type *)0x0) {
    if (entering_parallel == '\x01') {
      local_248.comm_[0].super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)((long)local_70->library_ * 8 + 1);
    }
    else {
      ppvVar2 = &(local_70->host_srcs_).read_.write_.shared_alloc_.direct_ptr;
      *(int *)ppvVar2 = *(int *)ppvVar2 + 1;
    }
  }
  local_248.comm_[0].super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_428.shared_alloc_.direct_ptr;
  local_248.comm_[1].super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_60
  ;
  if (((ulong)local_60 & 7) == 0 && local_60 != (element_type *)0x0) {
    if (entering_parallel == '\x01') {
      local_248.comm_[1].super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)((long)local_60->library_ * 8 + 1);
    }
    else {
      ppvVar2 = &(local_60->host_srcs_).read_.write_.shared_alloc_.direct_ptr;
      *(int *)ppvVar2 = *(int *)ppvVar2 + 1;
    }
  }
  local_248.comm_[1].super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         local_100.ranks.write_.shared_alloc_.direct_ptr;
  local_1b8 = local_50;
  if (((ulong)local_50 & 7) == 0 && local_50 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1b8 = (Alloc *)(local_50->size * 8 + 1);
    }
    else {
      local_50->use_count = local_50->use_count + 1;
    }
  }
  pvStack_1b0 = local_100.idxs.write_.shared_alloc_.direct_ptr;
  local_1a8 = local_40;
  if (((ulong)local_40 & 7) == 0 && local_40 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1a8 = (Alloc *)(local_40->size * 8 + 1);
    }
    else {
      local_40->use_count = local_40->use_count + 1;
    }
  }
  pvStack_1a0 = local_438.shared_alloc_.direct_ptr;
  local_248.roots2items_[1].write_.shared_alloc_.direct_ptr = pvVar7;
  local_248.items2content_[1].write_.shared_alloc_.direct_ptr = pvVar8;
  local_248.msgs2content_[0].write_.shared_alloc_.direct_ptr = pvVar9;
  local_b8 = pvVar7;
  local_98 = pvVar8;
  local_88 = pvVar9;
  if (0 < (int)uVar14) {
    local_3d8._8_8_ = local_2c8.write_.shared_alloc_.direct_ptr;
    local_3d8._0_8_ =
         local_248.parent_comm_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    if (((ulong)local_248.parent_comm_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr & 7) == 0 &&
        local_248.parent_comm_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        != (element_type *)0x0) {
      ppvVar2 = &((local_248.parent_comm_.
                   super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->host_srcs_
                 ).read_.write_.shared_alloc_.direct_ptr;
      *(int *)ppvVar2 = *(int *)ppvVar2 + -1;
      local_3d8._0_8_ =
           (long)(local_248.parent_comm_.
                  super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->library_ *
           8 + 1;
    }
    local_248.parent_comm_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_248.parent_comm_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_3d8._16_8_ = local_248.roots2items_[0].write_.shared_alloc_.alloc;
    local_3d8._24_8_ = local_3f0;
    if (((ulong)local_248.roots2items_[0].write_.shared_alloc_.alloc & 7) == 0 &&
        local_248.roots2items_[0].write_.shared_alloc_.alloc != (Alloc *)0x0) {
      (local_248.roots2items_[0].write_.shared_alloc_.alloc)->use_count =
           (local_248.roots2items_[0].write_.shared_alloc_.alloc)->use_count + -1;
      local_3d8._16_8_ = (local_248.roots2items_[0].write_.shared_alloc_.alloc)->size * 8 + 1;
    }
    local_248.roots2items_[0].write_.shared_alloc_.alloc = (Alloc *)0x0;
    local_248.roots2items_[0].write_.shared_alloc_.direct_ptr = (void *)0x0;
    local_3b8 = local_248.roots2items_[1].write_.shared_alloc_.alloc;
    if (((ulong)local_248.roots2items_[1].write_.shared_alloc_.alloc & 7) == 0 &&
        local_248.roots2items_[1].write_.shared_alloc_.alloc != (Alloc *)0x0) {
      (local_248.roots2items_[1].write_.shared_alloc_.alloc)->use_count =
           (local_248.roots2items_[1].write_.shared_alloc_.alloc)->use_count + -1;
      local_3b8 = (Alloc *)((local_248.roots2items_[1].write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    local_248.roots2items_[1].write_.shared_alloc_.alloc = (Alloc *)0x0;
    local_248.roots2items_[1].write_.shared_alloc_.direct_ptr = (void *)0x0;
    local_3a0 = local_408.shared_alloc_.direct_ptr;
    local_3a8 = local_248.items2content_[0].write_.shared_alloc_.alloc;
    if (((ulong)local_248.items2content_[0].write_.shared_alloc_.alloc & 7) == 0 &&
        local_248.items2content_[0].write_.shared_alloc_.alloc != (Alloc *)0x0) {
      (local_248.items2content_[0].write_.shared_alloc_.alloc)->use_count =
           (local_248.items2content_[0].write_.shared_alloc_.alloc)->use_count + -1;
      local_3a8 = (Alloc *)((local_248.items2content_[0].write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    local_248.items2content_[0].write_.shared_alloc_.alloc = (Alloc *)0x0;
    local_248.items2content_[0].write_.shared_alloc_.direct_ptr = (void *)0x0;
    local_398 = local_248.items2content_[1].write_.shared_alloc_.alloc;
    if (((ulong)local_248.items2content_[1].write_.shared_alloc_.alloc & 7) == 0 &&
        local_248.items2content_[1].write_.shared_alloc_.alloc != (Alloc *)0x0) {
      (local_248.items2content_[1].write_.shared_alloc_.alloc)->use_count =
           (local_248.items2content_[1].write_.shared_alloc_.alloc)->use_count + -1;
      local_398 = (Alloc *)((local_248.items2content_[1].write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    local_248.items2content_[1].write_.shared_alloc_.alloc = (Alloc *)0x0;
    local_248.items2content_[1].write_.shared_alloc_.direct_ptr = (void *)0x0;
    local_388 = local_248.msgs2content_[0].write_.shared_alloc_.alloc;
    if (((ulong)local_248.msgs2content_[0].write_.shared_alloc_.alloc & 7) == 0 &&
        local_248.msgs2content_[0].write_.shared_alloc_.alloc != (Alloc *)0x0) {
      (local_248.msgs2content_[0].write_.shared_alloc_.alloc)->use_count =
           (local_248.msgs2content_[0].write_.shared_alloc_.alloc)->use_count + -1;
      local_388 = (Alloc *)((local_248.msgs2content_[0].write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    local_248.msgs2content_[0].write_.shared_alloc_.alloc = (Alloc *)0x0;
    local_248.msgs2content_[0].write_.shared_alloc_.direct_ptr = (void *)0x0;
    local_370 = local_418.shared_alloc_.direct_ptr;
    local_378 = local_248.msgs2content_[1].write_.shared_alloc_.alloc;
    if (((ulong)local_248.msgs2content_[1].write_.shared_alloc_.alloc & 7) == 0 &&
        local_248.msgs2content_[1].write_.shared_alloc_.alloc != (Alloc *)0x0) {
      (local_248.msgs2content_[1].write_.shared_alloc_.alloc)->use_count =
           (local_248.msgs2content_[1].write_.shared_alloc_.alloc)->use_count + -1;
      local_378 = (Alloc *)((local_248.msgs2content_[1].write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    local_248.msgs2content_[1].write_.shared_alloc_.alloc = (Alloc *)0x0;
    local_248.msgs2content_[1].write_.shared_alloc_.direct_ptr = (void *)0x0;
    local_360._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_428.shared_alloc_.direct_ptr;
    local_368 = local_248.comm_[0].super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
    if (((ulong)local_248.comm_[0].super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr & 7) == 0 &&
        local_248.comm_[0].super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      ppvVar2 = &((local_248.comm_[0].super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->host_srcs_).read_.write_.shared_alloc_.direct_ptr;
      *(int *)ppvVar2 = *(int *)ppvVar2 + -1;
      local_368 = (element_type *)
                  ((long)(local_248.comm_[0].
                          super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                         library_ * 8 + 1);
    }
    local_248.comm_[0].super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_248.comm_[0].super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_350._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         local_100.ranks.write_.shared_alloc_.direct_ptr;
    local_358 = local_248.comm_[1].super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
    if (((ulong)local_248.comm_[1].super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr & 7) == 0 &&
        local_248.comm_[1].super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      ppvVar2 = &((local_248.comm_[1].super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->host_srcs_).read_.write_.shared_alloc_.direct_ptr;
      *(int *)ppvVar2 = *(int *)ppvVar2 + -1;
      local_358 = (element_type *)
                  ((long)(local_248.comm_[1].
                          super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                         library_ * 8 + 1);
    }
    local_248.comm_[1].super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_248.comm_[1].super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_340 = local_100.idxs.write_.shared_alloc_.direct_ptr;
    local_348 = local_1b8;
    if (((ulong)local_1b8 & 7) == 0 && local_1b8 != (Alloc *)0x0) {
      local_1b8->use_count = local_1b8->use_count + -1;
      local_348 = (Alloc *)(local_1b8->size * 8 + 1);
    }
    local_1b8 = (Alloc *)0x0;
    pvStack_1b0 = (void *)0x0;
    local_330 = local_438.shared_alloc_.direct_ptr;
    local_338 = local_1a8;
    if (((ulong)local_1a8 & 7) == 0 && local_1a8 != (Alloc *)0x0) {
      local_1a8->use_count = local_1a8->use_count + -1;
      local_338 = (Alloc *)(local_1a8->size * 8 + 1);
    }
    local_1a8 = (Alloc *)0x0;
    pvStack_1a0 = (void *)0x0;
    entering_parallel = '\0';
    uVar18 = 0;
    while (local_3b0 = pvVar7, local_390 = pvVar8, local_380 = pvVar9, uVar18 != uVar14) {
      iVar15 = *(int *)((long)(_func_int ***)local_2c8.write_.shared_alloc_.direct_ptr + uVar18 * 4)
      ;
      iVar6 = *(int *)((long)local_3f0 + uVar18 * 4);
      lVar16 = (long)iVar6;
      uVar3 = uVar18 + 1;
      iVar20 = *(int *)((long)local_3f0 + uVar18 * 4 + 4);
      if (iVar6 < iVar20) {
        uVar19 = (ulong)*(uint *)((long)pvVar7 + uVar3 * 4);
        do {
          iVar6 = *(int *)((long)pvVar7 + uVar18 * 4);
          lVar22 = (long)iVar6;
          if (iVar6 < (int)uVar19) {
            lVar17 = (long)iVar15;
            lVar21 = 0;
            do {
              *(undefined4 *)((long)local_408.shared_alloc_.direct_ptr + lVar21 * 4 + lVar17 * 4) =
                   *(undefined4 *)((long)pvVar8 + lVar21 * 4 + lVar22 * 4);
              *(undefined4 *)((long)local_418.shared_alloc_.direct_ptr + lVar21 * 4 + lVar17 * 4) =
                   *(undefined4 *)((long)pvVar9 + lVar21 * 4 + lVar22 * 4);
              *(undefined4 *)
               ((long)(_func_int ***)local_428.shared_alloc_.direct_ptr + lVar21 * 4 + lVar17 * 4) =
                   *(undefined4 *)
                    ((long)(_func_int ***)local_100.ranks.write_.shared_alloc_.direct_ptr +
                    lVar16 * 4);
              *(undefined4 *)((long)local_438.shared_alloc_.direct_ptr + lVar21 * 4 + lVar17 * 4) =
                   *(undefined4 *)
                    ((long)local_100.idxs.write_.shared_alloc_.direct_ptr + lVar16 * 4);
              uVar19 = (ulong)*(int *)((long)pvVar7 + uVar3 * 4);
              lVar4 = lVar22 + lVar21;
              lVar21 = lVar21 + 1;
            } while (lVar4 + 1 < (long)uVar19);
            iVar15 = iVar15 + (int)lVar21;
            iVar20 = *(int *)((long)local_3f0 + uVar3 * 4);
          }
          lVar16 = lVar16 + 1;
        } while (lVar16 < iVar20);
      }
      lVar16 = uVar18 * 4;
      uVar18 = uVar3;
      if (iVar15 != *(int *)((long)(_func_int ***)local_2c8.write_.shared_alloc_.direct_ptr +
                            lVar16 + 4)) {
        fail("assertion %s failed at %s +%d\n","item == own_verts2items[ov + 1]",
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_ghost.cpp"
             ,0x45);
      }
    }
    push_elem_uses(Omega_h::RemoteGraph,Omega_h::Dist)::$_0::~__0((__0 *)local_3d8);
  }
  push_elem_uses(Omega_h::RemoteGraph,Omega_h::Dist)::$_0::~__0((__0 *)&local_248);
  this = local_3e0;
  Dist::invert((Dist *)local_3d8,local_3e0);
  nrroots = Dist::nitems((Dist *)local_3d8);
  local_2f8.shared_alloc_.alloc = local_428.shared_alloc_.alloc;
  if (((ulong)local_428.shared_alloc_.alloc & 7) == 0 &&
      (element_type *)local_428.shared_alloc_.alloc != (element_type *)0x0) {
    if (entering_parallel == '\x01') {
      local_2f8.shared_alloc_.alloc = (Alloc *)((long)(local_428.shared_alloc_.alloc)->size * 8 + 1)
      ;
    }
    else {
      ppvVar2 = &(((HostRead<int> *)&(local_428.shared_alloc_.alloc)->ptr)->read_).write_.
                 shared_alloc_.direct_ptr;
      *(int *)ppvVar2 = *(int *)ppvVar2 + 1;
    }
  }
  local_2f8.shared_alloc_.direct_ptr = local_428.shared_alloc_.direct_ptr;
  Read<int>::Read(&local_130,&local_2f8);
  local_308.shared_alloc_.alloc = local_438.shared_alloc_.alloc;
  if (((ulong)local_438.shared_alloc_.alloc & 7) == 0 &&
      local_438.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_308.shared_alloc_.alloc = (Alloc *)((local_438.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_438.shared_alloc_.alloc)->use_count = (local_438.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_308.shared_alloc_.direct_ptr = local_438.shared_alloc_.direct_ptr;
  Read<int>::Read(&local_140,&local_308);
  Remotes::Remotes(&local_120,(Read<int> *)&local_130,(LOs *)&local_140);
  if (((ulong)local_140.write_.shared_alloc_.alloc & 7) == 0 &&
      local_140.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_140.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_140.write_.shared_alloc_.alloc);
      operator_delete(local_140.write_.shared_alloc_.alloc,0x48);
    }
  }
  pAVar10 = local_308.shared_alloc_.alloc;
  if (((ulong)local_308.shared_alloc_.alloc & 7) == 0 &&
      local_308.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_308.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_308.shared_alloc_.alloc);
      operator_delete(pAVar10,0x48);
    }
  }
  if (((ulong)local_130.write_.shared_alloc_.alloc & 7) == 0 &&
      local_130.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_130.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_130.write_.shared_alloc_.alloc);
      operator_delete(local_130.write_.shared_alloc_.alloc,0x48);
    }
  }
  pAVar10 = local_2f8.shared_alloc_.alloc;
  if (((ulong)local_2f8.shared_alloc_.alloc & 7) == 0 &&
      (element_type *)local_2f8.shared_alloc_.alloc != (element_type *)0x0) {
    ppvVar2 = &(((HostRead<int> *)&(local_2f8.shared_alloc_.alloc)->ptr)->read_).write_.
               shared_alloc_.direct_ptr;
    *(int *)ppvVar2 = *(int *)ppvVar2 + -1;
    if (*(int *)ppvVar2 == 0) {
      Alloc::~Alloc(local_2f8.shared_alloc_.alloc);
      operator_delete(pAVar10,0x48);
    }
  }
  Dist::parent_comm(this);
  local_288.ranks.write_.shared_alloc_.alloc = local_120.ranks.write_.shared_alloc_.alloc;
  if (((ulong)local_120.ranks.write_.shared_alloc_.alloc & 7) == 0 &&
      local_120.ranks.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_288.ranks.write_.shared_alloc_.alloc =
           (Alloc *)((local_120.ranks.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_120.ranks.write_.shared_alloc_.alloc)->use_count =
           (local_120.ranks.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_288.ranks.write_.shared_alloc_.direct_ptr = local_120.ranks.write_.shared_alloc_.direct_ptr;
  local_288.idxs.write_.shared_alloc_.alloc = local_120.idxs.write_.shared_alloc_.alloc;
  if (((ulong)local_120.idxs.write_.shared_alloc_.alloc & 7) == 0 &&
      local_120.idxs.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_288.idxs.write_.shared_alloc_.alloc =
           (Alloc *)((local_120.idxs.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_120.idxs.write_.shared_alloc_.alloc)->use_count =
           (local_120.idxs.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_288.idxs.write_.shared_alloc_.direct_ptr = local_120.idxs.write_.shared_alloc_.direct_ptr;
  Dist::Dist(&local_248,&local_150,&local_288,nrroots);
  pAVar10 = local_288.idxs.write_.shared_alloc_.alloc;
  if (((ulong)local_288.idxs.write_.shared_alloc_.alloc & 7) == 0 &&
      local_288.idxs.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_288.idxs.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_288.idxs.write_.shared_alloc_.alloc);
      operator_delete(pAVar10,0x48);
    }
  }
  pAVar10 = local_288.ranks.write_.shared_alloc_.alloc;
  if (((ulong)local_288.ranks.write_.shared_alloc_.alloc & 7) == 0 &&
      local_288.ranks.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_288.ranks.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_288.ranks.write_.shared_alloc_.alloc);
      operator_delete(pAVar10,0x48);
    }
  }
  if (local_150.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_150.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  local_318.shared_alloc_.alloc = local_408.shared_alloc_.alloc;
  if (((ulong)local_408.shared_alloc_.alloc & 7) == 0 &&
      local_408.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_318.shared_alloc_.alloc = (Alloc *)((local_408.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_408.shared_alloc_.alloc)->use_count = (local_408.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_318.shared_alloc_.direct_ptr = local_408.shared_alloc_.direct_ptr;
  Read<int>::Read(&local_180,&local_318);
  local_328.shared_alloc_.alloc = local_418.shared_alloc_.alloc;
  if (((ulong)local_418.shared_alloc_.alloc & 7) == 0 &&
      local_418.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_328.shared_alloc_.alloc = (Alloc *)((local_418.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_418.shared_alloc_.alloc)->use_count = (local_418.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_328.shared_alloc_.direct_ptr = local_418.shared_alloc_.direct_ptr;
  Read<int>::Read(&local_190,&local_328);
  Remotes::Remotes(&local_170,(Read<int> *)&local_180,(LOs *)&local_190);
  if (((ulong)local_190.write_.shared_alloc_.alloc & 7) == 0 &&
      local_190.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_190.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_190.write_.shared_alloc_.alloc);
      operator_delete(local_190.write_.shared_alloc_.alloc,0x48);
    }
  }
  pAVar10 = local_328.shared_alloc_.alloc;
  if (((ulong)local_328.shared_alloc_.alloc & 7) == 0 &&
      local_328.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_328.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_328.shared_alloc_.alloc);
      operator_delete(pAVar10,0x48);
    }
  }
  if (((ulong)local_180.write_.shared_alloc_.alloc & 7) == 0 &&
      local_180.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_180.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_180.write_.shared_alloc_.alloc);
      operator_delete(local_180.write_.shared_alloc_.alloc,0x48);
    }
  }
  pAVar10 = local_318.shared_alloc_.alloc;
  if (((ulong)local_318.shared_alloc_.alloc & 7) == 0 &&
      local_318.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_318.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_318.shared_alloc_.alloc);
      operator_delete(pAVar10,0x48);
    }
  }
  pRVar13 = local_198;
  local_2a8.ranks.write_.shared_alloc_.alloc = local_170.ranks.write_.shared_alloc_.alloc;
  if (((ulong)local_170.ranks.write_.shared_alloc_.alloc & 7) == 0 &&
      local_170.ranks.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_2a8.ranks.write_.shared_alloc_.alloc =
           (Alloc *)((local_170.ranks.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_170.ranks.write_.shared_alloc_.alloc)->use_count =
           (local_170.ranks.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_2a8.ranks.write_.shared_alloc_.direct_ptr = local_170.ranks.write_.shared_alloc_.direct_ptr;
  local_2a8.idxs.write_.shared_alloc_.alloc = local_170.idxs.write_.shared_alloc_.alloc;
  if (((ulong)local_170.idxs.write_.shared_alloc_.alloc & 7) == 0 &&
      local_170.idxs.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_2a8.idxs.write_.shared_alloc_.alloc =
           (Alloc *)((local_170.idxs.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_170.idxs.write_.shared_alloc_.alloc)->use_count =
           (local_170.idxs.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_2a8.idxs.write_.shared_alloc_.direct_ptr = local_170.idxs.write_.shared_alloc_.direct_ptr;
  Dist::exch(local_198,&local_248,&local_2a8,1);
  pAVar10 = local_2a8.idxs.write_.shared_alloc_.alloc;
  if (((ulong)local_2a8.idxs.write_.shared_alloc_.alloc & 7) == 0 &&
      local_2a8.idxs.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_2a8.idxs.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_2a8.idxs.write_.shared_alloc_.alloc);
      operator_delete(pAVar10,0x48);
    }
  }
  pAVar10 = local_2a8.ranks.write_.shared_alloc_.alloc;
  if (((ulong)local_2a8.ranks.write_.shared_alloc_.alloc & 7) == 0 &&
      local_2a8.ranks.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_2a8.ranks.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_2a8.ranks.write_.shared_alloc_.alloc);
      operator_delete(pAVar10,0x48);
    }
  }
  if (((ulong)local_170.idxs.write_.shared_alloc_.alloc & 7) == 0 &&
      local_170.idxs.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_170.idxs.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_170.idxs.write_.shared_alloc_.alloc);
      operator_delete(local_170.idxs.write_.shared_alloc_.alloc,0x48);
    }
  }
  if (((ulong)local_170.ranks.write_.shared_alloc_.alloc & 7) == 0 &&
      local_170.ranks.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_170.ranks.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_170.ranks.write_.shared_alloc_.alloc);
      operator_delete(local_170.ranks.write_.shared_alloc_.alloc,0x48);
    }
  }
  Dist::~Dist(&local_248);
  if (((ulong)local_120.idxs.write_.shared_alloc_.alloc & 7) == 0 &&
      local_120.idxs.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_120.idxs.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_120.idxs.write_.shared_alloc_.alloc);
      operator_delete(local_120.idxs.write_.shared_alloc_.alloc,0x48);
    }
  }
  if (((ulong)local_120.ranks.write_.shared_alloc_.alloc & 7) == 0 &&
      local_120.ranks.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_120.ranks.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_120.ranks.write_.shared_alloc_.alloc);
      operator_delete(local_120.ranks.write_.shared_alloc_.alloc,0x48);
    }
  }
  Dist::~Dist((Dist *)local_3d8);
  push_elem_uses(Omega_h::RemoteGraph,Omega_h::Dist)::$_0::~__0((__0 *)&local_e0);
  if (((ulong)local_438.shared_alloc_.alloc & 7) == 0 &&
      local_438.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_438.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_438.shared_alloc_.alloc);
      operator_delete(local_438.shared_alloc_.alloc,0x48);
    }
  }
  if (((ulong)local_428.shared_alloc_.alloc & 7) == 0 &&
      (element_type *)local_428.shared_alloc_.alloc != (element_type *)0x0) {
    ppvVar2 = &(((HostRead<int> *)&(local_428.shared_alloc_.alloc)->ptr)->read_).write_.
               shared_alloc_.direct_ptr;
    *(int *)ppvVar2 = *(int *)ppvVar2 + -1;
    if (*(int *)ppvVar2 == 0) {
      Alloc::~Alloc(local_428.shared_alloc_.alloc);
      operator_delete(local_428.shared_alloc_.alloc,0x48);
    }
  }
  if (((ulong)local_418.shared_alloc_.alloc & 7) == 0 &&
      local_418.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_418.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_418.shared_alloc_.alloc);
      operator_delete(local_418.shared_alloc_.alloc,0x48);
    }
  }
  if (((ulong)local_408.shared_alloc_.alloc & 7) == 0 &&
      local_408.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_408.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_408.shared_alloc_.alloc);
      operator_delete(local_408.shared_alloc_.alloc,0x48);
    }
  }
  if (((ulong)local_100.idxs.write_.shared_alloc_.alloc & 7) == 0 &&
      local_100.idxs.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_100.idxs.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_100.idxs.write_.shared_alloc_.alloc);
      operator_delete(local_100.idxs.write_.shared_alloc_.alloc,0x48);
    }
  }
  if (((ulong)local_100.ranks.write_.shared_alloc_.alloc & 7) == 0 &&
      (element_type *)local_100.ranks.write_.shared_alloc_.alloc != (element_type *)0x0) {
    ppvVar2 = &(((HostRead<int> *)&(local_100.ranks.write_.shared_alloc_.alloc)->ptr)->read_).write_
               .shared_alloc_.direct_ptr;
    *(int *)ppvVar2 = *(int *)ppvVar2 + -1;
    if (*(int *)ppvVar2 == 0) {
      Alloc::~Alloc(local_100.ranks.write_.shared_alloc_.alloc);
      operator_delete(local_100.ranks.write_.shared_alloc_.alloc,0x48);
    }
  }
  if (((ulong)local_2c8.write_.shared_alloc_.alloc & 7) == 0 &&
      (element_type *)local_2c8.write_.shared_alloc_.alloc != (element_type *)0x0) {
    ppvVar2 = &(((HostRead<int> *)&(local_2c8.write_.shared_alloc_.alloc)->ptr)->read_).write_.
               shared_alloc_.direct_ptr;
    *(int *)ppvVar2 = *(int *)ppvVar2 + -1;
    if (*(int *)ppvVar2 == 0) {
      Alloc::~Alloc(local_2c8.write_.shared_alloc_.alloc);
      operator_delete(local_2c8.write_.shared_alloc_.alloc,0x48);
    }
  }
  if (((ulong)local_3f8 & 7) == 0 && local_3f8 != (Alloc *)0x0) {
    piVar1 = &local_3f8->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_3f8);
      operator_delete(local_3f8,0x48);
    }
  }
  pAVar10 = local_258;
  if (((ulong)local_258 & 7) == 0 && local_258 != (Alloc *)0x0) {
    piVar1 = &local_258->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_258);
      operator_delete(pAVar10,0x48);
    }
  }
  pAVar10 = local_268;
  if (((ulong)local_268 & 7) == 0 && local_268 != (Alloc *)0x0) {
    piVar1 = &local_268->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_268);
      operator_delete(pAVar10,0x48);
    }
  }
  pAVar10 = local_2b8;
  if (((ulong)local_2b8 & 7) == 0 && local_2b8 != (Alloc *)0x0) {
    piVar1 = &local_2b8->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_2b8);
      operator_delete(pAVar10,0x48);
    }
  }
  return pRVar13;
}

Assistant:

Remotes push_elem_uses(RemoteGraph own_verts2own_elems, Dist own_verts2verts) {
  auto own_verts2serv_uses = own_verts2own_elems.locals2edges;
  auto serv_uses2own_elems = own_verts2own_elems.edges2remotes;
  auto nown_verts = own_verts2verts.nroots();
  auto own_verts2serv_verts = own_verts2verts.roots2items();
  auto own_verts2items =
      multiply_fans(own_verts2serv_uses, own_verts2serv_verts);
  auto nitems = own_verts2items.last();
  auto serv_verts2verts = own_verts2verts.items2dests();
  Write<I32> elem_ranks(nitems);
  Write<LO> elem_idxs(nitems);
  Write<I32> vert_ranks(nitems);
  Write<LO> vert_idxs(nitems);
  auto f = OMEGA_H_LAMBDA(LO ov) {
    auto item = own_verts2items[ov];
    for (auto sv = own_verts2serv_verts[ov]; sv < own_verts2serv_verts[ov + 1];
         ++sv) {
      for (auto su = own_verts2serv_uses[ov]; su < own_verts2serv_uses[ov + 1];
           ++su) {
        elem_ranks[item] = serv_uses2own_elems.ranks[su];
        elem_idxs[item] = serv_uses2own_elems.idxs[su];
        vert_ranks[item] = serv_verts2verts.ranks[sv];
        vert_idxs[item] = serv_verts2verts.idxs[sv];
        ++item;
      }
    }
    OMEGA_H_CHECK(item == own_verts2items[ov + 1]);
  };
  parallel_for(nown_verts, f, "push_elem_uses");
  auto verts2own_verts = own_verts2verts.invert();
  auto nverts = verts2own_verts.nitems();
  auto items2verts_map = Remotes(Read<I32>(vert_ranks), LOs(vert_idxs));
  Dist items2verts(own_verts2verts.parent_comm(), items2verts_map, nverts);
  auto items2own_elems = Remotes(Read<I32>(elem_ranks), LOs(elem_idxs));
  return items2verts.exch(items2own_elems, 1);
}